

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logic_program.h
# Opt level: O0

bool __thiscall
Clasp::Asp::LogicProgram::checkBody
          (LogicProgram *this,PrgBody *rhs,Body_t type,uint32 size,weight_t bound)

{
  bool bVar1;
  Body_t BVar2;
  uint uVar3;
  uint uVar4;
  uint32 uVar5;
  weight_t wVar6;
  PrgBody *this_00;
  uint32 in_ECX;
  PrgBody *in_RSI;
  LogicProgram *in_RDI;
  int in_R8D;
  undefined4 in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd8;
  Body_t local_4;
  
  bVar1 = PrgNode::relevant(&in_RSI->super_PrgNode);
  if (!bVar1) {
    bVar1 = PrgNode::eq(&in_RSI->super_PrgNode);
    in_stack_ffffffffffffffcc = in_stack_ffffffffffffffcc & 0xffffff;
    if (!bVar1) goto LAB_0018bc29;
    PrgNode::id(&in_RSI->super_PrgNode);
    getEqBody(in_RDI,in_stack_ffffffffffffffcc);
    this_00 = getBody(in_RDI,in_stack_ffffffffffffffcc);
    bVar1 = PrgNode::relevant(&this_00->super_PrgNode);
    in_stack_ffffffffffffffcc = in_stack_ffffffffffffffcc & 0xffffff;
    if (!bVar1) goto LAB_0018bc29;
  }
  BVar2 = PrgBody::type((PrgBody *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  uVar3 = Potassco::Body_t::operator_cast_to_unsigned_int((Body_t *)&stack0xffffffffffffffdc);
  uVar4 = Potassco::Body_t::operator_cast_to_unsigned_int(&local_4);
  in_stack_ffffffffffffffcc = 0;
  if (uVar3 == uVar4) {
    uVar5 = PrgBody::size(in_RSI);
    in_stack_ffffffffffffffcc = 0;
    if (uVar5 == in_ECX) {
      wVar6 = PrgBody::bound((PrgBody *)CONCAT44(BVar2.val_,in_stack_ffffffffffffffd8));
      in_stack_ffffffffffffffcc = (uint)(wVar6 == in_R8D) << 0x18;
    }
  }
LAB_0018bc29:
  return SUB41(in_stack_ffffffffffffffcc >> 0x18,0);
}

Assistant:

bool checkBody(const PrgBody& rhs, Body_t type, uint32 size, weight_t bound) const {
		return (rhs.relevant() || (rhs.eq() && getBody(getEqBody(rhs.id()))->relevant()))
			&& rhs.type() == type && rhs.size() == size && rhs.bound() == bound;
	}